

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_run(command *cmd)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  _Bool _Var1;
  wchar_t wVar2;
  trap_kind_conflict *ptVar3;
  trap_kind *web;
  loc_conflict lStack_18;
  wchar_t dir;
  loc_conflict grid;
  command *cmd_local;
  
  grid = (loc_conflict)cmd;
  wVar2 = cmd_get_direction(cmd,"direction",(int *)((long)&web + 4),false);
  if (wVar2 == L'\0') {
    grid_00.x = (player->grid).x;
    grid_00.y = (player->grid).y;
    _Var1 = square_iswebbed((chunk *)cave,grid_00);
    if (_Var1) {
      ptVar3 = lookup_trap("web");
      msg("You clear the web.");
      if (ptVar3 == (trap_kind_conflict *)0x0) {
        __assert_fail("web",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-cave.c"
                      ,0x63d,"void do_cmd_run(struct command *)");
      }
      grid_01.x = (player->grid).x;
      grid_01.y = (player->grid).y;
      square_remove_all_traps_of_type((chunk_conflict2 *)cave,grid_01,ptVar3->tidx);
      player->upkeep->energy_use = (uint)z_info->move_energy;
    }
    else {
      _Var1 = player_confuse_dir(player,(int *)((long)&web + 4),true);
      if (!_Var1) {
        if (web._4_4_ != L'\0') {
          lStack_18 = (loc_conflict)loc_sum(player->grid,ddgrid[web._4_4_]);
          _Var1 = do_cmd_walk_test(player,lStack_18);
          if (!_Var1) {
            return;
          }
          if (*(int *)((long)grid + 8) < 1) {
            player->upkeep->running = L'\0';
          }
          else {
            player->upkeep->running = *(wchar_t *)((long)grid + 8);
            *(undefined4 *)((long)grid + 8) = 0;
          }
        }
        run_step(web._4_4_);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_run(struct command *cmd)
{
	struct loc grid;
	int dir;

	/* Get arguments */
	if (cmd_get_direction(cmd, "direction", &dir, false) != CMD_OK)
		return;

	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		struct trap_kind *web = lookup_trap("web");

		msg("You clear the web.");
		assert(web);
		square_remove_all_traps_of_type(cave, player->grid, web->tidx);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}

	if (player_confuse_dir(player, &dir, true))
		return;

	/* Get location */
	if (dir) {
		grid = loc_sum(player->grid, ddgrid[dir]);
		if (!do_cmd_walk_test(player, grid))
			return;
			
		/* Hack: convert repeat count to running count */
		if (cmd->nrepeats > 0) {
			player->upkeep->running = cmd->nrepeats;
			cmd->nrepeats = 0;
		}
		else {
			player->upkeep->running = 0;
		}
	}

	/* Start run */
	run_step(dir);
}